

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O2

void __thiscall
TEST_GlobalMemoryAccountant_report_Test::TEST_GlobalMemoryAccountant_report_Test
          (TEST_GlobalMemoryAccountant_report_Test *this)

{
  memset(this,0,0x98);
  TEST_GROUP_CppUTestGroupGlobalMemoryAccountant::TEST_GROUP_CppUTestGroupGlobalMemoryAccountant
            (&this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant);
  (this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupGlobalMemoryAccountant_00388eb0;
  return;
}

Assistant:

TEST(GlobalMemoryAccountant, report)
{
    accountant.start();
    char* memory = new char[185];
    delete [] memory;
    accountant.stop();

    /* Allocation includes memory leak info */
    STRCMP_CONTAINS("1                1                 1", accountant.report().asCharString());
}